

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::FindLCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *pcVar1;
  undefined8 v;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  string local_9c8 [32];
  undefined1 local_9a8 [8];
  ostringstream cmCTestLog_msg_4;
  string local_830 [32];
  undefined1 local_810 [8];
  ostringstream cmCTestLog_msg_3;
  string local_698 [32];
  undefined1 local_678 [8];
  ostringstream cmCTestLog_msg_2;
  cmAlphaNum local_500;
  cmAlphaNum local_4d0;
  string local_4a0;
  undefined1 local_480 [8];
  string daGlob;
  undefined1 local_440 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_2b9;
  string local_2b8;
  undefined4 local_294;
  string local_290 [32];
  undefined1 local_270 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_f8 [8];
  cmWorkingDirectory workdir;
  string local_c8;
  undefined1 local_a8 [8];
  string buildDir;
  undefined1 local_78 [8];
  Glob gl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmCTestCoverageHandler *this_local;
  
  gl._80_8_ = files;
  cmsys::Glob::Glob((Glob *)local_78);
  cmsys::Glob::RecurseOff((Glob *)local_78);
  cmsys::Glob::RecurseThroughSymlinksOff((Glob *)local_78);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"BuildDirectory",(allocator<char> *)&workdir.field_0x27);
  cmCTest::GetCTestConfiguration((string *)local_a8,pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&workdir.field_0x27);
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_f8,(string *)local_a8);
  bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_f8);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
    poVar3 = std::operator<<((ostream *)local_270,"Unable to change working directory to ");
    poVar3 = std::operator<<(poVar3,(string *)local_a8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x65e,pcVar4,false);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
    this_local._7_1_ = false;
    local_294 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"profmerge",&local_2b9);
    timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar2 = cmSystemTools::RunSingleCommand
                      (&local_2b8,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                       (cmDuration)timeout.__r);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string((string *)local_480);
      cmAlphaNum::cmAlphaNum(&local_4d0,(string *)local_a8);
      cmAlphaNum::cmAlphaNum(&local_500,"/*.dpi");
      cmStrCat<>(&local_4a0,&local_4d0,&local_500);
      std::__cxx11::string::operator=((string *)local_480,(string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
      poVar3 = std::operator<<((ostream *)local_678,"   looking for dpi files in: ");
      poVar3 = std::operator<<(poVar3,(string *)local_480);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x66d,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_698);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
      this_local._7_1_ =
           cmsys::Glob::FindFiles((Glob *)local_78,(string *)local_480,(GlobMessages *)0x0);
      v = gl._80_8_;
      if (this_local._7_1_) {
        r = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_78);
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)v,r);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9a8);
        poVar3 = std::operator<<((ostream *)local_9a8,"Now searching in: ");
        poVar3 = std::operator<<(poVar3,(string *)local_480);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x675,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_9c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9a8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_810);
        poVar3 = std::operator<<((ostream *)local_810,"Error while finding files matching ");
        poVar3 = std::operator<<(poVar3,(string *)local_480);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x670,pcVar4,false);
        std::__cxx11::string::~string(local_830);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_810);
      }
      local_294 = 1;
      std::__cxx11::string::~string((string *)local_480);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_440);
      std::operator<<((ostream *)local_440,"Error while running profmerge.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x664,pcVar4,false);
      std::__cxx11::string::~string((string *)(daGlob.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_440);
      this_local._7_1_ = false;
      local_294 = 1;
    }
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_f8);
  std::__cxx11::string::~string((string *)local_a8);
  cmsys::Glob::~Glob((Glob *)local_78);
  return this_local._7_1_;
}

Assistant:

bool cmCTestCoverageHandler::FindLCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOff(); // No need of recurse if -prof_dir${BUILD_DIR} flag is
                   // used while compiling.
  gl.RecurseThroughSymlinksOff();
  std::string buildDir = this->CTest->GetCTestConfiguration("BuildDirectory");
  cmWorkingDirectory workdir(buildDir);
  if (workdir.Failed()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to change working directory to " << buildDir
                                                        << std::endl);
    return false;
  }

  // Run profmerge to merge all *.dyn files into dpi files
  if (!cmSystemTools::RunSingleCommand("profmerge")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error while running profmerge.\n");
    return false;
  }

  // DPI file should appear in build directory
  std::string daGlob;
  daGlob = cmStrCat(buildDir, "/*.dpi");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "   looking for dpi files in: " << daGlob << std::endl,
                     this->Quiet);
  if (!gl.FindFiles(daGlob)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding files matching " << daGlob << std::endl);
    return false;
  }
  cm::append(files, gl.GetFiles());
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Now searching in: " << daGlob << std::endl, this->Quiet);
  return true;
}